

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void __thiscall ExpressionContext::HideFunction(ExpressionContext *this,FunctionData *function)

{
  char *pcVar1;
  FunctionData **ppFVar2;
  ScopeData *pSVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  pcVar1 = (function->name->name).begin;
  if ((pcVar1 != (char *)0x0) && (*pcVar1 != '$')) {
    pSVar3 = this->scope;
    if ((pSVar3->type | SCOPE_FUNCTION) == SCOPE_TYPE) {
      pSVar3 = this->globalScope;
    }
    DirectChainedMap<IdentifierLookupResult>::remove
              (&pSVar3->idLookupMap,(char *)(ulong)function->nameHash);
  }
  pSVar3 = function->scope;
  uVar4 = (pSVar3->functions).count;
  uVar5 = (ulong)uVar4;
  if (uVar4 != 0) {
    uVar6 = 0;
    do {
      ppFVar2 = (pSVar3->functions).data;
      if (ppFVar2[uVar6] == function) {
        uVar4 = (int)uVar5 - 1;
        uVar5 = (ulong)uVar4;
        ppFVar2[uVar6] = ppFVar2[uVar5];
        (pSVar3->functions).count = uVar4;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar5);
  }
  return;
}

Assistant:

void ExpressionContext::HideFunction(FunctionData *function)
{
	// Don't have to remove internal functions since they are never added to lookup
	if(function->name->name.begin && *function->name->name.begin != '$')
	{
		if(scope->type == SCOPE_TYPE || scope->type == SCOPE_NAMESPACE)
			globalScope->idLookupMap.remove(function->nameHash, IdentifierLookupResult(function));
		else
			scope->idLookupMap.remove(function->nameHash, IdentifierLookupResult(function));
	}

	SmallArray<FunctionData*, 2> &scopeFunctions = function->scope->functions;

	for(unsigned i = 0; i < scopeFunctions.size(); i++)
	{
		if(scopeFunctions[i] == function)
		{
			scopeFunctions[i] = scopeFunctions.back();
			scopeFunctions.pop_back();
		}
	}
}